

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O2

void __thiscall
math::wide_integer::uintwide_t<48U,_unsigned_short,_void,_false>::eval_divide_by_single_limb
          (uintwide_t<48U,_unsigned_short,_void,_false> *this,limb_type_conflict short_denominator,
          unsigned_fast_type u_offset,uintwide_t<24U,_unsigned_char,_void,_false> *remainder)

{
  undefined8 in_RAX;
  ulong uVar1;
  uint uVar2;
  undefined6 in_register_00000032;
  long lVar3;
  undefined8 uStack_18;
  
  lVar3 = (long)(0x300000000 - (u_offset << 0x20)) >> 0x1f;
  uVar2 = 0;
  uVar1 = 0;
  while( true ) {
    if (lVar3 == 0) break;
    uVar2 = (uVar2 - (int)uVar1 * (int)CONCAT62(in_register_00000032,short_denominator)) * 0x10000 |
            (uint)*(ushort *)(this + lVar3 + -2);
    uVar1 = (ulong)uVar2 / (CONCAT62(in_register_00000032,short_denominator) & 0xffffffff);
    *(short *)(this + lVar3 + -2) = (short)uVar1;
    lVar3 = lVar3 + -2;
  }
  if (remainder != (uintwide_t<24U,_unsigned_char,_void,_false> *)0x0) {
    uStack_18 = in_RAX;
    uintwide_t<48u,unsigned_short,void,false>::uintwide_t<unsigned_short>(unsigned_short,std::
    enable_if<(std::is_integral<unsigned_short>::value&&std::is_unsigned<unsigned_short>::
    value)&&(std::numeric_limits<unsigned_short>::digits<=std::numeric_limits<unsigned_short>::
    digits),void>::type__
              ((void *)((long)&uStack_18 + 2),(short)uVar2 - (short)uVar1 * short_denominator,
               (enable_if_t<(std::is_integral<unsigned_short>::value_&&_std::is_unsigned<unsigned_short>::value_&&_(std::numeric_limits<unsigned_short>::digits_<__std::numeric_limits<limb_type>::digits))>
                *)0x0);
    *(undefined2 *)(remainder[1].values.super_array<unsigned_char,_3UL>.elems + 1) = uStack_18._6_2_
    ;
    *(undefined4 *)remainder = uStack_18._2_4_;
  }
  return;
}

Assistant:

constexpr auto eval_divide_by_single_limb(const limb_type          short_denominator,
                                              const unsigned_fast_type u_offset,
                                                    uintwide_t*        remainder) -> void
    {
      // The denominator has one single limb.
      // Use a one-dimensional division algorithm.

      auto long_numerator = double_limb_type { };
      auto hi_part        = static_cast<limb_type>(UINT8_C(0));

      {
        reverse_iterator
          ri
          {
            detail::advance_and_point
            (
              values.begin(),
              static_cast<size_t>(number_of_limbs - static_cast<size_t>(u_offset))
            )
          };

        for( ; ri != values.rend(); ++ri) // NOLINT(altera-id-dependent-backward-branch)
        {
          long_numerator =
            static_cast<double_limb_type>
            (
               *ri
             + static_cast<double_limb_type>
               (
                    static_cast<double_limb_type>
                    (
                        long_numerator
                      - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                    )
                 << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
               )
            );

          *ri = detail::make_lo<limb_type>(static_cast<double_limb_type>(long_numerator / short_denominator));

          hi_part = *ri;
        }
      }

      if(remainder != nullptr)
      {
        long_numerator =
          static_cast<double_limb_type>
          (
             static_cast<double_limb_type>(*values.cbegin())
           + static_cast<double_limb_type>
             (
                  static_cast<double_limb_type>
                  (
                    long_numerator - static_cast<double_limb_type>(static_cast<double_limb_type>(short_denominator) * hi_part)
                  )
               << static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
             )
          );

        *remainder =
          static_cast<limb_type>
          (
            long_numerator >> static_cast<unsigned>(std::numeric_limits<limb_type>::digits)
          );
      }
    }